

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

int __thiscall ncnn::ParamDict::load_param(ParamDict *this,FILE *fp)

{
  bool bVar1;
  int iVar2;
  float *pfVar3;
  char *pcVar4;
  undefined8 in_RSI;
  char *in_RDI;
  bool is_float_1;
  int nscan_1;
  char vstr_1 [16];
  int *ptr_1;
  float *ptr;
  bool is_float;
  char vstr [16];
  int j;
  int nscan;
  int len;
  bool is_array;
  int id;
  int local_7c;
  Allocator *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff9c;
  Mat *in_stack_ffffffffffffffa0;
  undefined1 local_48 [28];
  int local_2c;
  int local_28;
  int local_24;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar5;
  
  clear((ParamDict *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  iVar5 = 0;
  do {
    iVar2 = __isoc99_fscanf(in_RSI,"%d=",&stack0xffffffffffffffe4);
    if (iVar2 != 1) {
      return 0;
    }
    if (iVar5 < -0x5b03) {
      iVar5 = -0x5b04 - iVar5;
      local_24 = 0;
      local_28 = __isoc99_fscanf(in_RSI,"%d",&local_24);
      if (local_28 != 1) {
        fprintf(_stderr,"ParamDict read array length fail\n");
        return -1;
      }
      Mat::create(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90,
                  in_stack_ffffffffffffff88);
      for (local_2c = 0; local_2c < local_24; local_2c = local_2c + 1) {
        local_28 = __isoc99_fscanf(in_RSI,",%15[^,\n ]",local_48);
        if (local_28 != 1) {
          fprintf(_stderr,"ParamDict read array element fail\n");
          return -1;
        }
        bVar1 = vstr_is_float(in_RDI);
        if (bVar1) {
          pfVar3 = Mat::operator_cast_to_float_((Mat *)(in_RDI + (long)iVar5 * 0x48 + 8));
          local_28 = __isoc99_sscanf(local_48,"%f",pfVar3 + local_2c);
        }
        else {
          in_stack_ffffffffffffffa0 =
               (Mat *)Mat::operator_cast_to_int_((Mat *)(in_RDI + (long)iVar5 * 0x48 + 8));
          local_28 = __isoc99_sscanf(local_48,"%d",
                                     (int *)((long)&in_stack_ffffffffffffffa0->data +
                                            (long)local_2c * 4));
        }
        if (local_28 != 1) {
          fprintf(_stderr,"ParamDict parse array element fail\n");
          return -1;
        }
      }
    }
    else {
      iVar2 = __isoc99_fscanf(in_RSI,"%15s",&stack0xffffffffffffff88);
      if (iVar2 != 1) {
        fprintf(_stderr,"ParamDict read value fail\n");
        return -1;
      }
      bVar1 = vstr_is_float(in_RDI);
      if (bVar1) {
        local_7c = __isoc99_sscanf(&stack0xffffffffffffff88,"%f",in_RDI + (long)iVar5 * 0x48 + 4);
      }
      else {
        local_7c = __isoc99_sscanf(&stack0xffffffffffffff88,"%d",in_RDI + (long)iVar5 * 0x48 + 4);
      }
      if (local_7c != 1) {
        fprintf(_stderr,"ParamDict parse value fail\n");
        return -1;
      }
    }
    pcVar4 = in_RDI + (long)iVar5 * 0x48;
    pcVar4[0] = '\x01';
    pcVar4[1] = '\0';
    pcVar4[2] = '\0';
    pcVar4[3] = '\0';
  } while( true );
}

Assistant:

int ParamDict::load_param(FILE* fp)
{
    clear();

//     0=100 1=1.250000 -23303=5,0.1,0.2,0.4,0.8,1.0

    // parse each key=value pair
    int id = 0;
    while (fscanf(fp, "%d=", &id) == 1)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (is_array)
        {
            int len = 0;
            int nscan = fscanf(fp, "%d", &len);
            if (nscan != 1)
            {
                fprintf(stderr, "ParamDict read array length fail\n");
                return -1;
            }

            params[id].v.create(len);

            for (int j = 0; j < len; j++)
            {
                char vstr[16];
                nscan = fscanf(fp, ",%15[^,\n ]", vstr);
                if (nscan != 1)
                {
                    fprintf(stderr, "ParamDict read array element fail\n");
                    return -1;
                }

                bool is_float = vstr_is_float(vstr);

                if (is_float)
                {
                    float* ptr = params[id].v;
                    nscan = sscanf(vstr, "%f", &ptr[j]);
                }
                else
                {
                    int* ptr = params[id].v;
                    nscan = sscanf(vstr, "%d", &ptr[j]);
                }
                if (nscan != 1)
                {
                    fprintf(stderr, "ParamDict parse array element fail\n");
                    return -1;
                }
            }
        }
        else
        {
            char vstr[16];
            int nscan = fscanf(fp, "%15s", vstr);
            if (nscan != 1)
            {
                fprintf(stderr, "ParamDict read value fail\n");
                return -1;
            }

            bool is_float = vstr_is_float(vstr);

            if (is_float)
                nscan = sscanf(vstr, "%f", &params[id].f);
            else
                nscan = sscanf(vstr, "%d", &params[id].i);
            if (nscan != 1)
            {
                fprintf(stderr, "ParamDict parse value fail\n");
                return -1;
            }
        }

        params[id].loaded = 1;
    }

    return 0;
}